

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_swap_before_finish_test(bool run)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Offset<MyGame::Example::Monster> root;
  Offset<MyGame::Example::Monster> root_00;
  undefined7 in_register_00000039;
  string local_140;
  TestHeapBuilder dst;
  TestHeapBuilder src;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)&src.super_FlatBufferBuilder);
    root = populate1(&src.super_FlatBufferBuilder);
    uVar2 = src.super_FlatBufferBuilder.buf_.size_;
    TestHeapBuilder::TestHeapBuilder(&dst);
    root_00 = populate2(&dst.super_FlatBufferBuilder);
    uVar1 = dst.super_FlatBufferBuilder.buf_.size_;
    flatbuffers::FlatBufferBuilderImpl<false>::Swap
              (&src.super_FlatBufferBuilder,&dst.super_FlatBufferBuilder);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              (&src.super_FlatBufferBuilder,root_00,(char *)0x0);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              (&dst.super_FlatBufferBuilder,root,(char *)0x0);
    TestEq<bool,bool>(uVar1 < src.super_FlatBufferBuilder.buf_.size_,true,
                      "\'src.GetSize() > size2\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb1,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    TestEq<bool,bool>(uVar2 < dst.super_FlatBufferBuilder.buf_.size_,true,
                      "\'dst.GetSize() > size1\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb2,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    m2_name_abi_cxx11_();
    bVar3 = release_n_verify(&src.super_FlatBufferBuilder,&local_140,Color_Green);
    TestEq<bool,bool>(true,bVar3,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb3,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_140);
    m1_name_abi_cxx11_();
    bVar3 = release_n_verify(&dst.super_FlatBufferBuilder,&local_140,Color_Red);
    TestEq<bool,bool>(true,bVar3,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb4,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_140);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&dst.super_FlatBufferBuilder);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&src.super_FlatBufferBuilder);
  }
  return;
}

Assistant:

static void builder_swap_before_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      src.Finish(root_offset2);
      dst.Finish(root_offset1);
      TEST_EQ_FUNC(src.GetSize() > size2, true);
      TEST_EQ_FUNC(dst.GetSize() > size1, true);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }